

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  stbi_uc sVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  stbi_uc *psVar16;
  stbi_uc *__s;
  stbi_uc *psVar17;
  undefined4 in_register_0000000c;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint n;
  uint uVar23;
  uint uVar24;
  stbi_uc (*pal) [4];
  uint uVar25;
  size_t __size;
  uint uVar26;
  size_t __size_00;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar11 = stbi__gif_header(s,g,comp,0);
    if (iVar11 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar11 = g->h * g->w;
    __size = (size_t)(iVar11 * 4);
    psVar16 = (stbi_uc *)calloc(1,__size);
    g->out = psVar16;
    __s = (stbi_uc *)malloc(__size);
    g->background = __s;
    __size_00 = (size_t)iVar11;
    psVar17 = (stbi_uc *)malloc(__size_00);
    g->history = psVar17;
    if (psVar16 == (stbi_uc *)0x0) {
      stbi__g_failure_reason = "outofmem";
      return (stbi_uc *)0x0;
    }
    memset(__s,0,__size);
    memset(psVar17,0,__size_00);
  }
  else {
    uVar23 = (uint)g->eflags >> 2 & 7;
    uVar10 = g->h * g->w;
    uVar26 = uVar23;
    if (uVar23 == 3) {
      uVar26 = 2;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar26 = uVar23;
    }
    if (uVar26 == 3) {
      uVar18 = 0;
      uVar19 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar19 = uVar18;
      }
      for (; uVar19 != uVar18; uVar18 = uVar18 + 1) {
        if (g->history[uVar18] != '\0') {
          *(undefined4 *)(g->out + uVar18 * 4) =
               *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar18 * 4);
        }
      }
    }
    else if (uVar26 == 2) {
      uVar18 = 0;
      uVar19 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar19 = uVar18;
      }
      for (; uVar19 != uVar18; uVar18 = uVar18 + 1) {
        if (g->history[uVar18] != '\0') {
          *(undefined4 *)(g->out + uVar18 * 4) = *(undefined4 *)(g->background + uVar18 * 4);
        }
      }
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
    psVar17 = g->history;
    __size_00 = (long)g->h * (long)g->w;
  }
  memset(psVar17,0,__size_00);
  pal = g->pal;
  while (sVar7 = stbi__get8(s), sVar7 == '!') {
    sVar7 = stbi__get8(s);
    if (sVar7 == 0xf9) {
      bVar8 = stbi__get8(s);
      if (bVar8 == 4) {
        bVar8 = stbi__get8(s);
        g->eflags = (uint)bVar8;
        iVar11 = stbi__get16le(s);
        g->delay = iVar11 * 10;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) == 0) {
          stbi__skip(s,1);
          g->transparent = -1;
        }
        else {
          bVar8 = stbi__get8(s);
          g->transparent = (uint)bVar8;
          g->pal[bVar8][3] = '\0';
        }
        goto LAB_00151ab6;
      }
      stbi__skip(s,(uint)bVar8);
    }
    else {
LAB_00151ab6:
      while (bVar8 = stbi__get8(s), bVar8 != 0) {
        stbi__skip(s,(uint)bVar8);
      }
    }
  }
  if (sVar7 == ';') {
    return (stbi_uc *)s;
  }
  if (sVar7 == ',') {
    iVar11 = stbi__get16le(s);
    iVar12 = stbi__get16le(s);
    iVar13 = stbi__get16le(s);
    iVar14 = stbi__get16le(s);
    pcVar3 = "bad Image Descriptor";
    if ((iVar13 + iVar11 <= g->w) && (iVar14 + iVar12 <= g->h)) {
      iVar20 = g->w * 4;
      g->line_size = iVar20;
      g->start_x = iVar11 << 2;
      g->start_y = iVar12 * iVar20;
      g->max_x = (iVar13 + iVar11) * 4;
      g->max_y = iVar20 * (iVar14 + iVar12);
      g->cur_x = iVar11 << 2;
      g->cur_y = iVar12 * iVar20;
      bVar8 = stbi__get8(s);
      g->lflags = (uint)bVar8;
      iVar11 = g->line_size * 8;
      if ((bVar8 & 0x40) == 0) {
        iVar11 = g->line_size;
      }
      g->step = iVar11;
      g->parse = (int)((uint)bVar8 << 0x19) >> 0x1f & 3;
      if ((char)bVar8 < '\0') {
        pal = g->lpal;
        if ((g->eflags & 1) == 0) {
          iVar11 = -1;
        }
        else {
          iVar11 = g->transparent;
        }
        stbi__gif_parse_colortable(s,pal,2 << (bVar8 & 7),iVar11);
      }
      else if ((g->flags & 0x80) == 0) {
        stbi__g_failure_reason = "missing color table";
        return (stbi_uc *)0x0;
      }
      g->color_table = *pal;
      bVar8 = stbi__get8(s);
      pcVar3 = stbi__g_failure_reason;
      if (bVar8 < 0xd) {
        uVar26 = 1 << (bVar8 & 0x1f);
        for (uVar19 = 0; uVar26 != uVar19; uVar19 = uVar19 + 1) {
          g->codes[uVar19].prefix = -1;
          g->codes[uVar19].first = (stbi_uc)uVar19;
          g->codes[uVar19].suffix = (stbi_uc)uVar19;
        }
        uVar22 = (2 << (bVar8 & 0x1f)) - 1;
        n = 0;
        uVar23 = 0 << (bVar8 & 0x1f);
        iVar12 = 0;
        bVar4 = false;
        uVar5 = 0xffffffff;
        uVar6 = uVar26 + 2;
        iVar11 = bVar8 + 1;
        uVar10 = uVar22;
        while( true ) {
          do {
            for (; uVar15 = uVar10, iVar13 = iVar11, uVar21 = uVar6, uVar24 = uVar5, bVar2 = bVar4,
                iVar11 = iVar12 - iVar13, iVar12 < iVar13; iVar12 = iVar12 + 8) {
              if (n == 0) {
                bVar9 = stbi__get8(s);
                if (bVar9 == 0) goto LAB_00151e18;
                n = (uint)bVar9;
              }
              n = n - 1;
              bVar9 = stbi__get8(s);
              uVar23 = uVar23 | (uint)bVar9 << ((byte)iVar12 & 0x1f);
              bVar4 = bVar2;
              uVar5 = uVar24;
              uVar6 = uVar21;
              iVar11 = iVar13;
              uVar10 = uVar15;
            }
            uVar10 = (int)uVar23 >> ((byte)iVar13 & 0x1f);
            uVar25 = uVar23 & uVar15;
            uVar23 = uVar10;
            iVar12 = iVar11;
            bVar4 = true;
            uVar5 = 0xffffffff;
            uVar6 = uVar26 + 2;
            iVar11 = bVar8 + 1;
            uVar10 = uVar22;
          } while (uVar25 == uVar26);
          if (uVar25 == uVar26 + 1) break;
          if ((int)uVar21 < (int)uVar25) {
            stbi__g_failure_reason = "illegal code in raster";
            return (stbi_uc *)0x0;
          }
          if (!bVar2) {
            stbi__g_failure_reason = "no clear code";
            return (stbi_uc *)0x0;
          }
          if ((int)uVar24 < 0) {
            if (uVar25 == uVar21) {
              stbi__g_failure_reason = "illegal code in raster";
              return (stbi_uc *)0x0;
            }
          }
          else {
            if (0x1fff < (int)uVar21) {
              stbi__g_failure_reason = "too many codes";
              return (stbi_uc *)0x0;
            }
            g->codes[(int)uVar21].prefix = (stbi__int16)uVar24;
            sVar7 = g->codes[uVar24].first;
            g->codes[(int)uVar21].first = sVar7;
            if (uVar25 != uVar21 + 1) {
              sVar7 = g->codes[(int)uVar25].first;
            }
            g->codes[(int)uVar21].suffix = sVar7;
            uVar21 = uVar21 + 1;
          }
          stbi__out_gif_code(g,(stbi__uint16)uVar25);
          iVar11 = iVar13 + 1;
          uVar10 = ~(-1 << ((byte)iVar11 & 0x1f));
          if (0xfff < (int)uVar21 || (uVar21 & uVar15) != 0) {
            uVar10 = uVar15;
            iVar11 = iVar13;
          }
          bVar4 = true;
          uVar5 = uVar25;
          uVar6 = uVar21;
        }
        do {
          stbi__skip(s,n);
          bVar8 = stbi__get8(s);
          n = (uint)bVar8;
        } while (bVar8 != 0);
LAB_00151e18:
        psVar17 = g->out;
        if (psVar17 == (stbi_uc *)0x0) {
          return (stbi_uc *)0x0;
        }
        if (psVar1 == (stbi_uc *)0x0) {
          if (0 < g->bgindex) {
            uVar26 = g->h * g->w;
            uVar18 = 0;
            uVar19 = (ulong)uVar26;
            if ((int)uVar26 < 1) {
              uVar19 = uVar18;
            }
            for (; uVar19 != uVar18; uVar18 = uVar18 + 1) {
              if (g->history[uVar18] == '\0') {
                g->pal[g->bgindex][3] = 0xff;
                *(stbi_uc (*) [4])(g->out + uVar18 * 4) = g->pal[g->bgindex];
              }
            }
            return psVar17;
          }
          return psVar17;
        }
        return psVar17;
      }
    }
  }
  else {
    pcVar3 = "unknown code";
  }
  stbi__g_failure_reason = pcVar3;
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose; 
   int first_frame; 
   int pi; 
   int pcount; 

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0; 
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0))     return 0; // stbi__g_failure_reason set by stbi__gif_header
      g->out = (stbi_uc *) stbi__malloc(4 * g->w * g->h);
      g->background = (stbi_uc *) stbi__malloc(4 * g->w * g->h); 
      g->history = (stbi_uc *) stbi__malloc(g->w * g->h); 
      if (g->out == 0)                      return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "tranparent" at the start - ie, nothing overwrites the current background; 
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to teh color that was there the previous frame. 
      memset( g->out, 0x00, 4 * g->w * g->h ); 
      memset( g->background, 0x00, 4 * g->w * g->h ); // state of the background (starts transparent)
      memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame
      first_frame = 1; 
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2; 
      pcount = g->w * g->h; 

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 ); 
            }
         }
      } else if (dispose == 2) { 
         // restore what was changed last frame to background before that frame; 
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 ); 
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just 
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame; 
      memcpy( g->background, g->out, 4 * g->w * g->h ); 
   }

   // clear my history; 
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s); 
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");            
            
            o = stbi__process_gif_raster(s, g);
            if (o == NULL) return NULL;

            // if this was the first frame, 
            pcount = g->w * g->h; 
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be; 
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 ); 
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s); 
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255; 
                  } 
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0; 
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1); 
                     g->transparent = -1; 
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            } 
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}